

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::disconnect(Federate *this)

{
  ConnectorFederateManager *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  finalize(this);
  this_00 = (this->cManager)._M_t.
            super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
            .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl;
  if (this_00 != (ConnectorFederateManager *)0x0) {
    ConnectorFederateManager::disconnect(this_00);
  }
  CoreFactory::getEmptyCore();
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_20;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void Federate::disconnect()
{
    finalize();
    if (cManager) {
        cManager->disconnect();
    }
    coreObject = CoreFactory::getEmptyCore();
}